

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,error_code *ec)

{
  jsonpointer_errc __e;
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  type tVar5;
  size_t index;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (current);
  if (bVar2) {
    if ((buffer->_M_len != 1) || (*buffer->_M_str != '-')) {
      index = 0;
      tVar5 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (buffer->_M_str,buffer->_M_len,&index);
      sVar1 = index;
      if (tVar5.ec != success) {
        __e = invalid_index;
        goto LAB_002f5299;
      }
      sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        (current);
      if (sVar1 < sVar3) {
        pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (current,index);
        return pbVar4;
      }
    }
    __e = index_exceeds_array_size;
  }
  else {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (current);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        (current,buffer);
      if (bVar2) {
        pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (current,buffer);
        return pbVar4;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
LAB_002f5299:
  std::error_code::operator=(ec,__e);
  return current;
}

Assistant:

const Json* resolve(const Json* current, const typename Json::string_view_type& buffer, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return current;
            }
            current = std::addressof(current->at(buffer));
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }